

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * google::protobuf::compiler::js::anon_unknown_0::ToLowerCamel
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *words)

{
  pointer pbVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  string word;
  byte *local_48 [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = 0;
  uVar4 = 0;
  do {
    pbVar1 = (words->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(words->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string
              ((string *)local_48,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
    bVar2 = *local_48[0];
    if (uVar4 == 0) {
      if ((byte)(bVar2 + 0xbf) < 0x1a) {
        bVar2 = bVar2 | 0x20;
        goto LAB_0025bc23;
      }
    }
    else if ((byte)(bVar2 + 0x9f) < 0x1a) {
      bVar2 = bVar2 - 0x20;
LAB_0025bc23:
      *local_48[0] = bVar2;
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_48);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x20;
  } while( true );
}

Assistant:

string ToLowerCamel(const std::vector<string>& words) {
  string result;
  for (int i = 0; i < words.size(); i++) {
    string word = words[i];
    if (i == 0 && (word[0] >= 'A' && word[0] <= 'Z')) {
      word[0] = (word[0] - 'A') + 'a';
    } else if (i != 0 && (word[0] >= 'a' && word[0] <= 'z')) {
      word[0] = (word[0] - 'a') + 'A';
    }
    result += word;
  }
  return result;
}